

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O3

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_text<kiste::line_t>
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,line_t *line)

{
  pointer psVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  string *expression;
  pointer psVar5;
  
  if (line->_curly_level != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"  ",2);
      uVar4 = uVar4 + 1;
    } while (uVar4 < line->_curly_level);
  }
  bVar2 = line_t::starts_with_text(line);
  bVar3 = bVar2 & line->_previous_line_ends_with_text;
  if (bVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"                ",0x10);
  }
  psVar5 = (line->super_line_data_t)._segments.
           super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (line->super_line_data_t)._segments.
           super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (psVar5 == psVar1) {
      if ((line->_next_line_starts_with_text == false) && (bVar3 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,");",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\n",1);
      return;
    }
    expression = (string *)((long)psVar5 + 0x10);
    switch(*(undefined4 *)((long)(expression + -1) + 0x18)) {
    case 1:
      if (bVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->_serialize->_os,"_serialize.text(",0x10);
      }
      text_segment(this,expression);
      bVar3 = 1;
    default:
      goto switchD_00106ca1_caseD_2;
    case 3:
      if (bVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,");",2);
      }
      escape(this,expression);
      break;
    case 4:
      if (bVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,");",2);
      }
      raw(this,expression);
      break;
    case 5:
      if (bVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,");",2);
      }
      call(this,expression);
    }
    bVar3 = 0;
switchD_00106ca1_caseD_2:
    psVar5 = (pointer)(expression + 1);
  } while( true );
}

Assistant:

void render_text(const Line& line)
    {
      for (std::size_t i = 0; i < line._curly_level; ++i)
      {
        _serialize.text("  ");
      }
      auto string_opened = line.starts_with_text() && line._previous_line_ends_with_text;
      if (string_opened)
      {
        _serialize.text("                ");
      }
      for (const auto& segment : line._segments)
      {
        switch (segment._type)
        {
        case segment_type::cpp:
          break;
        case segment_type::text:
          static_assert(std::is_same<decltype(open_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (open_string(string_opened));
          static_assert(std::is_same<decltype(text_segment(segment._text)), void>::value,
                        "$call{} requires void expression");
          (text_segment(segment._text));
          break;
        case segment_type::trim_trailing_return:
          break;
        case segment_type::escape:
          static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (close_string(string_opened));
          static_assert(std::is_same<decltype(escape(segment._text)), void>::value,
                        "$call{} requires void expression");
          (escape(segment._text));
          break;
        case segment_type::call:
          static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (close_string(string_opened));
          static_assert(std::is_same<decltype(call(segment._text)), void>::value,
                        "$call{} requires void expression");
          (call(segment._text));
          break;
        case segment_type::raw:
          static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (close_string(string_opened));
          static_assert(std::is_same<decltype(raw(segment._text)), void>::value,
                        "$call{} requires void expression");
          (raw(segment._text));
          break;
        }
      }
      if (not line._next_line_starts_with_text)
      {
        static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                      "$call{} requires void expression");
        (close_string(string_opened));
      }
      _serialize.text("\n");
    }